

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigPackage.cpp
# Opt level: O2

int __thiscall glcts::ConfigPackage::init(ConfigPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ConfigListCase *pCVar1;
  
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"es2",
             "OpenGL ES 2 Configurations",(ApiType)0x2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"es3",
             "OpenGL ES 3 Configurations",(ApiType)0x3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"es31",
             "OpenGL ES 3.1 Configurations",(ApiType)0x13);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"es32",
             "OpenGL ES 3.2 Configurations",(ApiType)0x23);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl30",
             "OpenGL 3.0 Configurations",(ApiType)0x103);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl31",
             "OpenGL 3.1 Configurations",(ApiType)0x113);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl32",
             "OpenGL 3.2 Configurations",(ApiType)0x123);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl33",
             "OpenGL 3.3 Configurations",(ApiType)0x133);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl40",
             "OpenGL 4.0 Configurations",(ApiType)0x104);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl41",
             "OpenGL 4.1 Configurations",(ApiType)0x114);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl42",
             "OpenGL 4.2 Configurations",(ApiType)0x124);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl43",
             "OpenGL 4.3 Configurations",(ApiType)0x134);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl44",
             "OpenGL 4.4 Configurations",(ApiType)0x144);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ConfigListCase *)operator_new(0x78);
  ConfigListCase::ConfigListCase
            (pCVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"gl45",
             "OpenGL 4.5 Configurations",(ApiType)0x154);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  return extraout_EAX;
}

Assistant:

void ConfigPackage::init(void)
{
	addChild(new ConfigListCase(m_testCtx, "es2", "OpenGL ES 2 Configurations", glu::ApiType::es(2, 0)));
	addChild(new ConfigListCase(m_testCtx, "es3", "OpenGL ES 3 Configurations", glu::ApiType::es(3, 0)));
	addChild(new ConfigListCase(m_testCtx, "es31", "OpenGL ES 3.1 Configurations", glu::ApiType::es(3, 1)));
	addChild(new ConfigListCase(m_testCtx, "es32", "OpenGL ES 3.2 Configurations", glu::ApiType::es(3, 2)));
	addChild(new ConfigListCase(m_testCtx, "gl30", "OpenGL 3.0 Configurations", glu::ApiType::core(3, 0)));
	addChild(new ConfigListCase(m_testCtx, "gl31", "OpenGL 3.1 Configurations", glu::ApiType::core(3, 1)));
	addChild(new ConfigListCase(m_testCtx, "gl32", "OpenGL 3.2 Configurations", glu::ApiType::core(3, 2)));
	addChild(new ConfigListCase(m_testCtx, "gl33", "OpenGL 3.3 Configurations", glu::ApiType::core(3, 3)));
	addChild(new ConfigListCase(m_testCtx, "gl40", "OpenGL 4.0 Configurations", glu::ApiType::core(4, 0)));
	addChild(new ConfigListCase(m_testCtx, "gl41", "OpenGL 4.1 Configurations", glu::ApiType::core(4, 1)));
	addChild(new ConfigListCase(m_testCtx, "gl42", "OpenGL 4.2 Configurations", glu::ApiType::core(4, 2)));
	addChild(new ConfigListCase(m_testCtx, "gl43", "OpenGL 4.3 Configurations", glu::ApiType::core(4, 3)));
	addChild(new ConfigListCase(m_testCtx, "gl44", "OpenGL 4.4 Configurations", glu::ApiType::core(4, 4)));
	addChild(new ConfigListCase(m_testCtx, "gl45", "OpenGL 4.5 Configurations", glu::ApiType::core(4, 5)));
}